

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Try * __thiscall MixedArena::alloc<wasm::Try>(MixedArena *this)

{
  Try *pTVar1;
  
  pTVar1 = (Try *)allocSpace(this,0x78,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id = TryId;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements =
       0;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0;
  (pTVar1->name).super_IString.str._M_len = 0;
  (pTVar1->name).super_IString.str._M_str = (char *)0x0;
  (pTVar1->catchTags).allocator = this;
  (pTVar1->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pTVar1->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (pTVar1->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pTVar1->catchBodies).allocator = this;
  (pTVar1->delegateTarget).super_IString.str._M_len = 0;
  (pTVar1->delegateTarget).super_IString.str._M_str = (char *)0x0;
  return pTVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }